

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage_conversions.cpp
# Opt level: O0

void convert_ARGB_PM_to_Indexed8(QImageData *dst,QImageData *src,ImageConversionFlags flags)

{
  long lVar1;
  QImageData *p;
  QImageData *in_RDI;
  long in_FS_OFFSET;
  QScopedPointer<QImageData,_QScopedPointerDeleter<QImageData>_> tmp;
  QImageData *in_stack_00000148;
  QImageData *in_stack_00000150;
  ImageConversionFlags in_stack_000001ac;
  int in_stack_ffffffffffffff98;
  ImageConversionFlag in_stack_ffffffffffffff9c;
  QSize *this;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  Representation in_stack_ffffffffffffffe4;
  QScopedPointer<QImageData,_QScopedPointerDeleter<QImageData>_> size;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  size.d = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  this = (QSize *)&stack0xffffffffffffffe0;
  QSize::QSize(this,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  p = QImageData::create(size.d,in_stack_ffffffffffffffe4.m_i);
  QScopedPointer<QImageData,_QScopedPointerDeleter<QImageData>_>::QScopedPointer
            ((QScopedPointer<QImageData,_QScopedPointerDeleter<QImageData>_> *)
             &stack0xffffffffffffffe8,p);
  QScopedPointer<QImageData,_QScopedPointerDeleter<QImageData>_>::data
            ((QScopedPointer<QImageData,_QScopedPointerDeleter<QImageData>_> *)
             &stack0xffffffffffffffe8);
  QFlags<Qt::ImageConversionFlag>::QFlags
            ((QFlags<Qt::ImageConversionFlag> *)this,in_stack_ffffffffffffff9c);
  convert_generic((QImageData *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI
                  ,dst._4_4_);
  QScopedPointer<QImageData,_QScopedPointerDeleter<QImageData>_>::data
            ((QScopedPointer<QImageData,_QScopedPointerDeleter<QImageData>_> *)
             &stack0xffffffffffffffe8);
  convert_RGB_to_Indexed8(in_stack_00000150,in_stack_00000148,in_stack_000001ac);
  QScopedPointer<QImageData,_QScopedPointerDeleter<QImageData>_>::~QScopedPointer
            ((QScopedPointer<QImageData,_QScopedPointerDeleter<QImageData>_> *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void convert_ARGB_PM_to_Indexed8(QImageData *dst, const QImageData *src, Qt::ImageConversionFlags flags)
{
    QScopedPointer<QImageData> tmp(QImageData::create(QSize(src->width, src->height), QImage::Format_ARGB32));
    convert_generic(tmp.data(), src, Qt::AutoColor);
    convert_RGB_to_Indexed8(dst, tmp.data(), flags);
}